

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorController::auth_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  bool bVar1;
  CChainParams *pCVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  local_b8;
  undefined1 local_9a [2];
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code == 0xfa) {
    bVar1 = ::LogAcceptCategory((LogFlags)this,(Level)_conn);
    if (bVar1) {
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      logging_function._M_str = "auth_cb";
      logging_function._M_len = 7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x1ca,TOR,Debug,(ConstevalFormatString<0U>)0x6c06a2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-onion",(allocator<char> *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_9a + 2),"",(allocator<char> *)local_9a);
    ArgsManager::GetArg(&local_58,&gArgs,&local_78,(string *)(local_9a + 2));
    bVar1 = std::operator==(&local_58,"");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)(local_9a + 2));
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"GETINFO net/listeners/socks",(allocator<char> *)&local_b8);
      local_98._M_dataplus._M_p = (pointer)get_socks_cb;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = (size_type)this;
      std::function<void(TorControlConnection&,TorControlReply_const&)>::
      function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                ((function<void(TorControlConnection&,TorControlReply_const&)> *)&local_78,
                 (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                  *)(local_9a + 2));
      TorControlConnection::Command(_conn,&local_58,(ReplyHandlerCB *)&local_78);
      std::_Function_base::~_Function_base((_Function_base *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
    if ((this->private_key)._M_string_length == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&this->private_key,"NEW:ED25519-V3");
    }
    pCVar2 = Params();
    local_9a = (undefined1  [2])pCVar2->nDefaultPort;
    CService::ToStringAddrPort_abi_cxx11_(&local_78,&this->m_target);
    tinyformat::format<std::__cxx11::string,unsigned_short,std::__cxx11::string>
              (&local_58,(tinyformat *)"ADD_ONION %s Port=%i,%s",(char *)&this->private_key,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a,
               (unsigned_short *)&local_78,in_R9);
    local_b8._M_f = (offset_in_TorController_to_subr)add_onion_cb;
    local_b8._8_8_ = 0;
    local_b8._M_bound_args.
    super__Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
    super__Head_base<0UL,_TorController_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
         (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
    std::function<void(TorControlConnection&,TorControlReply_const&)>::
    function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
              ((function<void(TorControlConnection&,TorControlReply_const&)> *)(local_9a + 2),
               &local_b8);
    TorControlConnection::Command(_conn,&local_58,(ReplyHandlerCB *)(local_9a + 2));
    std::_Function_base::~_Function_base((_Function_base *)(local_9a + 2));
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00335fb0:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00335fb0;
    logging_function_00._M_str = "auth_cb";
    logging_function_00._M_len = 7;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x1db,ALL,Info,(ConstevalFormatString<0U>)0x6c0700
              );
  }
  return;
}

Assistant:

void TorController::auth_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "Authentication successful\n");

        // Now that we know Tor is running setup the proxy for onion addresses
        // if -onion isn't set to something else.
        if (gArgs.GetArg("-onion", "") == "") {
            _conn.Command("GETINFO net/listeners/socks", std::bind(&TorController::get_socks_cb, this, std::placeholders::_1, std::placeholders::_2));
        }

        // Finally - now create the service
        if (private_key.empty()) { // No private key, generate one
            private_key = "NEW:ED25519-V3"; // Explicitly request key type - see issue #9214
        }
        // Request onion service, redirect port.
        // Note that the 'virtual' port is always the default port to avoid decloaking nodes using other ports.
        _conn.Command(strprintf("ADD_ONION %s Port=%i,%s", private_key, Params().GetDefaultPort(), m_target.ToStringAddrPort()),
            std::bind(&TorController::add_onion_cb, this, std::placeholders::_1, std::placeholders::_2));
    } else {
        LogPrintf("tor: Authentication failed\n");
    }
}